

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcomplex.c
# Opt level: O2

double z_abs(doublecomplex *z)

{
  doublecomplex dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  double dVar5;
  
  dVar1 = *z;
  auVar4._0_8_ = -dVar1.r;
  auVar4._8_8_ = -dVar1.i;
  auVar4 = maxpd(auVar4,(undefined1  [16])dVar1);
  dVar5 = auVar4._8_8_;
  dVar3 = auVar4._0_8_;
  dVar2 = dVar5;
  if (dVar5 <= dVar3) {
    dVar2 = dVar3;
  }
  if ((dVar3 + dVar5 == dVar2) && (!NAN(dVar3 + dVar5) && !NAN(dVar2))) {
    return dVar2;
  }
  if (dVar5 <= dVar3) {
    dVar3 = dVar5;
  }
  return dVar2 * SQRT((dVar3 / dVar2) * (dVar3 / dVar2) + 1.0);
}

Assistant:

double z_abs(doublecomplex *z)
{
    double temp;
    double real = z->r;
    double imag = z->i;

    if (real < 0) real = -real;
    if (imag < 0) imag = -imag;
    if (imag > real) {
	temp = real;
	real = imag;
	imag = temp;
    }
    if ((real+imag) == real) return(real);
  
    temp = imag/real;
    temp = real*sqrt(1.0 + temp*temp);  /*overflow!!*/
    return (temp);
}